

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O3

DynamicType * __thiscall Js::DynamicObject::DuplicateType(DynamicObject *this)

{
  Recycler *pRVar1;
  DynamicType *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  pRVar1 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  local_40 = (undefined1  [8])&DynamicType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9a6b17a;
  data.filename._0_4_ = 0x21d;
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,(TrackAllocData *)local_40);
  this_00 = (DynamicType *)new<Memory::Recycler>(0x38,pRVar1,0x387914);
  DynamicType::DynamicType(this_00,(DynamicType *)(this->super_RecyclableObject).type.ptr);
  return this_00;
}

Assistant:

DynamicType* DynamicObject::DuplicateType()
    {
        return RecyclerNew(GetRecycler(), DynamicType, this->GetDynamicType());
    }